

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_vfprintf(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  io_private *piVar1;
  jx9_io_stream *pjVar2;
  int nArg_00;
  char *pcVar3;
  int nLen;
  fprintf_data sFdata;
  SySet sArg;
  
  if ((((nArg < 3) || (((*apArg)->iFlags & 0x100) == 0)) || ((apArg[1]->iFlags & 1) == 0)) ||
     ((apArg[2]->iFlags & 0x40) == 0)) {
    pcVar3 = "Invalid arguments";
  }
  else {
    piVar1 = (io_private *)((*apArg)->x).pOther;
    if ((piVar1 != (io_private *)0x0) && (piVar1->iMagic == 0xfeac14)) {
      pjVar2 = piVar1->pStream;
      if (pjVar2 == (jx9_io_stream *)0x0) {
        pcVar3 = "null_stream";
      }
      else {
        if (pjVar2->xWrite != (_func_jx9_int64_void_ptr_void_ptr_jx9_int64 *)0x0) {
          pcVar3 = jx9_value_to_string(apArg[1],&nLen);
          if (0 < nLen) {
            nArg_00 = jx9HashmapValuesToSet((jx9_hashmap *)(apArg[2]->x).pOther,&sArg);
            sFdata.nCount = 0;
            sFdata.pIO = piVar1;
            jx9InputFormat(fprintfConsumer,pCtx,pcVar3,nLen,nArg_00,(jx9_value **)sArg.pBase,&sFdata
                           ,1);
            jx9_result_int64(pCtx,sFdata.nCount);
            SySetRelease(&sArg);
            return 0;
          }
          goto LAB_0013720a;
        }
        pcVar3 = pjVar2->zName;
      }
      jx9_context_throw_error_format
                (pCtx,2,"IO routine(%s) not implemented in the underlying stream(%s) device",
                 (pCtx->pFunc->sName).zString,pcVar3);
      goto LAB_0013720a;
    }
    pcVar3 = "Expecting an IO handle";
  }
  jx9_context_throw_error(pCtx,2,pcVar3);
LAB_0013720a:
  jx9_result_int(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_vfprintf(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	fprintf_data sFdata;
	const char *zFormat;
	jx9_hashmap *pMap;
	io_private *pDev;
	SySet sArg;
	int n, nLen;
	if( nArg < 3 || !jx9_value_is_resource(apArg[0]) || !jx9_value_is_string(apArg[1])  || !jx9_value_is_json_array(apArg[2]) ){
		/* Missing/Invalid arguments, return zero */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Invalid arguments");
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	if( pDev->pStream == 0  || pDev->pStream->xWrite == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device", 
			jx9_function_name(pCtx), pDev->pStream ? pDev->pStream->zName : "null_stream"
			);
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the string format */
	zFormat = jx9_value_to_string(apArg[1], &nLen);
	if( nLen < 1 ){
		/* Empty string, return zero */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Point to hashmap */
	pMap = (jx9_hashmap *)apArg[2]->x.pOther;
	/* Extract arguments from the hashmap */
	n = jx9HashmapValuesToSet(pMap, &sArg);
	/* Prepare our private data */
	sFdata.nCount = 0;
	sFdata.pIO = pDev;
	/* Format the string */
	jx9InputFormat(fprintfConsumer, pCtx, zFormat, nLen, n, (jx9_value **)SySetBasePtr(&sArg), (void *)&sFdata, TRUE);
	/* Return total number of bytes written*/
	jx9_result_int64(pCtx, sFdata.nCount);
	SySetRelease(&sArg);
	return JX9_OK;
}